

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# markdown.cpp
# Opt level: O3

void __thiscall markdown::Document::Document(Document *this,size_t spacesPerTab)

{
  Container *p;
  LinkIds *pLVar1;
  _List_base<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
  local_30;
  
  this->cSpacesPerTab = spacesPerTab;
  p = (Container *)operator_new(0x28);
  local_30._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)&local_30;
  local_30._M_impl._M_node._M_size = 0;
  (p->super_Token)._vptr_Token = (_func_int **)&PTR__Container_001665b0;
  local_30._M_impl._M_node.super__List_node_base._M_prev =
       local_30._M_impl._M_node.super__List_node_base._M_next;
  std::__cxx11::
  list<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>::
  list(&p->mSubTokens,
       (list<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
        *)local_30._M_impl._M_node.super__List_node_base._M_next);
  p->mParagraphMode = false;
  boost::shared_ptr<markdown::Token>::shared_ptr<markdown::token::Container>
            (&this->mTokenContainer,p);
  std::__cxx11::
  _List_base<boost::shared_ptr<markdown::Token>,_std::allocator<boost::shared_ptr<markdown::Token>_>_>
  ::_M_clear(&local_30);
  pLVar1 = (LinkIds *)operator_new(0x30);
  (pLVar1->mTable).table_.
  super_functions<boost::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .current_ = '\0';
  (pLVar1->mTable).table_.bucket_count_ = 0x10;
  (pLVar1->mTable).table_.size_ = 0;
  (pLVar1->mTable).table_.mlf_ = 1.0;
  (pLVar1->mTable).table_.max_load_ = 0;
  (pLVar1->mTable).table_.buckets_ = (bucket_pointer)0x0;
  this->mIdTable = pLVar1;
  this->mProcessed = false;
  return;
}

Assistant:

Document::Document(size_t spacesPerTab): cSpacesPerTab(spacesPerTab),
	mTokenContainer(new token::Container), mIdTable(new LinkIds),
	mProcessed(false)
{
	// This space deliberately blank ;-)
}